

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O2

void ApprovalTests::
     TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
     verifyAll<std::initializer_list<int>>
               (string *header,initializer_list<int> *list,Options *options)

{
  int i;
  undefined4 local_2c;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = &local_2c;
  local_2c = 0;
  local_28._8_8_ = 0;
  local_10 = ::std::
             _Function_handler<void_(int,_std::basic_ostream<char,_std::char_traits<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/Approvals.h:129:17)>
             ::_M_invoke;
  local_18 = ::std::
             _Function_handler<void_(int,_std::basic_ostream<char,_std::char_traits<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/Approvals.h:129:17)>
             ::_M_manager;
  verifyAll<std::initializer_list<int>>
            (header,list,
             (function<void_(int,_std::basic_ostream<char,_std::char_traits<char>_>_&)> *)&local_28,
             options);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

static void verifyAll(const std::string& header,
                              const Container& list,
                              const Options& options = Options())
        {
            int i = 0;
            verifyAll<Container>(
                header,
                list,
                [&](typename Container::value_type e, std::ostream& s) {
                    s << "[" << i++
                      << "] = " << TCompileTimeOptions::ToStringConverter::toString(e);
                },
                options);
        }